

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

string * __thiscall
PatternAddressMapper::get_mapping_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,PatternAddressMapper *this)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  string *psVar3;
  pointer piVar4;
  ulong uVar5;
  ostream *poVar6;
  mapped_type *this_00;
  long lVar7;
  _Hash_node_base *p_Var8;
  key_type *pkVar9;
  stringstream local_200 [8];
  stringstream mapping_str;
  long local_1f0 [2];
  undefined8 uStack_1e0;
  uint auStack_1d8 [22];
  ios_base local_180 [264];
  string *local_78;
  string local_70;
  PatternAddressMapper *local_50;
  key_type *pkStack_48;
  vector<int,_std::allocator<int>_> keys;
  
  pkStack_48 = (key_type *)0x0;
  keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  p_Var8 = (this->aggressor_to_addr)._M_h._M_before_begin._M_nxt;
  local_50 = this;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      if (keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&pkStack_48,
                   (iterator)
                   keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(int *)(p_Var8 + 1));
      }
      else {
        *keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = *(int *)&p_Var8[1]._M_nxt;
        keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  piVar4 = keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pkVar9 = pkStack_48;
  if (pkStack_48 !=
      keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = (long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start - (long)pkStack_48 >> 2;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pkStack_48,
               keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pkVar9,piVar4);
  }
  local_78 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_200);
  piVar4 = keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pkStack_48 !=
      keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    local_50 = (PatternAddressMapper *)&local_50->aggressor_to_addr;
    uVar5 = 0;
    lVar7 = 0;
    pkVar9 = pkStack_48;
    do {
      if ((lVar7 != 0) && (-lVar7 == (uVar5 / 3) * 3)) {
        std::ios::widen((char)*(undefined8 *)(local_1f0[0] + -0x18) + (char)local_1f0);
        std::ostream::put((char)local_1f0);
        std::ostream::flush();
      }
      *(undefined8 *)((long)&uStack_1e0 + *(long *)(local_1f0[0] + -0x18)) = 3;
      *(uint *)((long)auStack_1d8 + *(long *)(local_1f0[0] + -0x18)) =
           *(uint *)((long)auStack_1d8 + *(long *)(local_1f0[0] + -0x18)) & 0xffffff4f | 0x20;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1f0,*pkVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
      pp_Var1 = poVar6->_vptr_basic_ostream;
      *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var1[-3]) = 0xd;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar6->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar6->field_0x18 + (long)p_Var2) & 0xffffff4f | 0x20;
      this_00 = std::__detail::
                _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)local_50,pkVar9);
      DRAMAddr::to_string_compact_abi_cxx11_(&local_70,this_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"   ",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      pkVar9 = pkVar9 + 1;
      lVar7 = lVar7 + -1;
    } while (pkVar9 != piVar4);
  }
  psVar3 = local_78;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_200);
  std::ios_base::~ios_base(local_180);
  if (pkStack_48 != (key_type *)0x0) {
    operator_delete(pkStack_48,
                    (long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pkStack_48);
  }
  return psVar3;
}

Assistant:

std::string PatternAddressMapper::get_mapping_text_repr() {
  // get all keys (this is to not assume that keys always must start by 1) and sort them
  std::vector<int> keys;
  for (auto const &map: aggressor_to_addr) keys.push_back(map.first);
  std::sort(keys.begin(), keys.end());

  // iterate over keys and build text representation
  size_t cnt = 0;
  std::stringstream mapping_str;
  for (const auto &k : keys) {
    if (cnt > 0 && cnt%3==0) mapping_str << std::endl;
    mapping_str << std::setw(3) << std::left << k
                << " -> "
                << std::setw(13) << std::left << aggressor_to_addr.at(k).to_string_compact()
                << "   ";
    cnt++;
  }

  return mapping_str.str();
}